

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::RepeatedPtrFieldTest_NaturalGrowthOnArenasReuseBlocks_Test::
~RepeatedPtrFieldTest_NaturalGrowthOnArenasReuseBlocks_Test
          (RepeatedPtrFieldTest_NaturalGrowthOnArenasReuseBlocks_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RepeatedPtrFieldTest, NaturalGrowthOnArenasReuseBlocks) {
  using Elem = std::string;
  using Field = RepeatedPtrField<Elem>;

  Arena arena;
  std::vector<Field*> fields;
  static constexpr int kNumFields = 100;
  static constexpr int kNumElems = 1000;
  std::optional<int> common_capacity;
  for (int i = 0; i < kNumFields; ++i) {
    fields.push_back(Arena::Create<Field>(&arena));
    auto& field = *fields.back();
    for (int j = 0; j < kNumElems; ++j) {
      field.Add("");
    }
    if (!common_capacity.has_value()) {
      common_capacity = field.Capacity();
    } else {
      ASSERT_EQ(field.Capacity(), *common_capacity);
    }
  }

  const size_t expected = kNumFields * (*common_capacity) * sizeof(Elem*) +
                          kNumFields * kNumElems * sizeof(Elem);
  // Use a 2% slack for other overhead.
  // If we were not reusing the blocks, the actual value would be ~2x the
  // expected.
  EXPECT_THAT(arena.SpaceUsed(), AllOf(Ge(expected), Le(1.02 * expected)));
}